

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdopt.c
# Opt level: O0

void init_mbmi(MB_MODE_INFO *mbmi,PREDICTION_MODE curr_mode,MV_REFERENCE_FRAME *ref_frames,
              AV1_COMMON *cm)

{
  undefined1 in_CL;
  undefined1 in_CH;
  undefined6 in_register_0000000a;
  undefined1 *in_RDX;
  undefined1 in_SIL;
  long in_RDI;
  PALETTE_MODE_INFO *pmi;
  
  *(ushort *)(in_RDI + 0xa7) = *(ushort *)(in_RDI + 0xa7) & 0xffcf;
  *(undefined1 *)(in_RDI + 2) = in_SIL;
  *(undefined1 *)(in_RDI + 3) = 0;
  *(undefined1 *)(in_RDI + 0x10) = *in_RDX;
  *(undefined1 *)(in_RDI + 0x11) = in_RDX[1];
  *(undefined1 *)(in_RDI + 0x8e) = 0;
  *(undefined1 *)(in_RDI + 0x8f) = 0;
  *(undefined1 *)(in_RDI + 0x5b) = 0;
  *(undefined4 *)(in_RDI + 0xc) = 0;
  *(undefined4 *)(in_RDI + 8) = 0;
  *(undefined1 *)(in_RDI + 0x18) = 0;
  *(undefined1 *)(in_RDI + 0x40) = 0xff;
  set_default_interp_filters
            ((MB_MODE_INFO *)CONCAT62(in_register_0000000a,CONCAT11(in_CH,in_CL)),
             (InterpFilter)((ulong)(in_RDI + 0x5e) >> 0x38));
  return;
}

Assistant:

static inline void init_mbmi(MB_MODE_INFO *mbmi, PREDICTION_MODE curr_mode,
                             const MV_REFERENCE_FRAME *ref_frames,
                             const AV1_COMMON *cm) {
  PALETTE_MODE_INFO *const pmi = &mbmi->palette_mode_info;
  mbmi->ref_mv_idx = 0;
  mbmi->mode = curr_mode;
  mbmi->uv_mode = UV_DC_PRED;
  mbmi->ref_frame[0] = ref_frames[0];
  mbmi->ref_frame[1] = ref_frames[1];
  pmi->palette_size[0] = 0;
  pmi->palette_size[1] = 0;
  mbmi->filter_intra_mode_info.use_filter_intra = 0;
  mbmi->mv[0].as_int = mbmi->mv[1].as_int = 0;
  mbmi->motion_mode = SIMPLE_TRANSLATION;
  mbmi->interintra_mode = (INTERINTRA_MODE)(II_DC_PRED - 1);
  set_default_interp_filters(mbmi, cm->features.interp_filter);
}